

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_disconnect(CHAR_DATA *ch,char *argument)

{
  string_view fmt;
  bool bVar1;
  int iVar2;
  int iVar3;
  CHAR_DATA *pCVar4;
  long in_RDI;
  int desc;
  CHAR_DATA *victim;
  DESCRIPTOR_DATA *d;
  char arg [4608];
  undefined4 in_stack_ffffffffffffedb8;
  undefined4 in_stack_ffffffffffffedbc;
  char *in_stack_ffffffffffffedc0;
  CHAR_DATA *in_stack_ffffffffffffedc8;
  undefined4 in_stack_ffffffffffffedd0;
  int in_stack_ffffffffffffedd4;
  DESCRIPTOR_DATA *pDVar5;
  char in_stack_ffffffffffffede8;
  undefined1 in_stack_ffffffffffffede9 [15];
  
  one_argument(in_stack_ffffffffffffedc0,
               (char *)CONCAT44(in_stack_ffffffffffffedbc,in_stack_ffffffffffffedb8));
  if (in_stack_ffffffffffffede8 == '\0') {
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0),
                 in_stack_ffffffffffffedc8);
  }
  else {
    bVar1 = is_number((char *)CONCAT44(in_stack_ffffffffffffedbc,in_stack_ffffffffffffedb8));
    if (bVar1) {
      in_stack_ffffffffffffedd4 = atoi(&stack0xffffffffffffede8);
      for (pDVar5 = descriptor_list; pDVar5 != (DESCRIPTOR_DATA *)0x0; pDVar5 = pDVar5->next) {
        if (pDVar5->descriptor == in_stack_ffffffffffffedd4) {
          close_socket((DESCRIPTOR_DATA *)arg._32_8_);
          send_to_char((char *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0),
                       in_stack_ffffffffffffedc8);
          return;
        }
      }
    }
    pCVar4 = get_char_world((CHAR_DATA *)arg._4504_8_,(char *)arg._4496_8_);
    if (pCVar4 == (CHAR_DATA *)0x0) {
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0),
                   in_stack_ffffffffffffedc8);
    }
    else {
      iVar2 = (int)*(short *)(in_RDI + 0x138);
      iVar3 = get_trust((CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffedb8));
      if (iVar3 < iVar2) {
        pDVar5 = descriptor_list;
        if (pCVar4->desc == (DESCRIPTOR_DATA *)0x0) {
          act((char *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0),
              in_stack_ffffffffffffedc8,in_stack_ffffffffffffedc0,
              (void *)CONCAT44(iVar2,in_stack_ffffffffffffedb8),0);
        }
        else {
          for (; pDVar5 != (DESCRIPTOR_DATA *)0x0; pDVar5 = pDVar5->next) {
            if (pDVar5 == pCVar4->desc) {
              close_socket((DESCRIPTOR_DATA *)arg._32_8_);
              send_to_char((char *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0),
                           in_stack_ffffffffffffedc8);
              return;
            }
          }
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0),
                     (char *)in_stack_ffffffffffffedc8);
          fmt._1_15_ = in_stack_ffffffffffffede9;
          fmt._M_len._0_1_ = in_stack_ffffffffffffede8;
          CLogger::Warn<>((CLogger *)pDVar5,fmt);
          send_to_char((char *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0),
                       in_stack_ffffffffffffedc8);
        }
      }
      else {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0),
                     in_stack_ffffffffffffedc8);
      }
    }
  }
  return;
}

Assistant:

void do_disconnect(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	DESCRIPTOR_DATA *d;
	CHAR_DATA *victim;

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Disconnect whom?\n\r", ch);
		return;
	}

	if (is_number(arg))
	{
		int desc = atoi(arg);
		for (d = descriptor_list; d != nullptr; d = d->next)
		{
			if (d->descriptor == desc)
			{
				close_socket(d);
				send_to_char("Ok.\n\r", ch);
				return;
			}
		}
	}

	victim = get_char_world(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (ch->level <= get_trust(victim))
	{
		send_to_char("Not at your level!\n\r", ch);
		return;
	}

	if (victim->desc == nullptr)
	{
		act("$N doesn't have a descriptor.", ch, nullptr, victim, TO_CHAR);
		return;
	}

	for (d = descriptor_list; d != nullptr; d = d->next)
	{
		if (d == victim->desc)
		{
			close_socket(d);
			send_to_char("Ok.\n\r", ch);
			return;
		}
	}

	RS.Logger.Warn("Do_disconnect: desc not found.");
	send_to_char("Descriptor not found!\n\r", ch);
}